

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_intrin_avx2.c
# Opt level: O0

void av1_block_error_block_size64_avx2
               (int16_t *coeff,int16_t *dqcoeff,__m256i *sse_256,intptr_t block_size)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long in_RCX;
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i sse_256_temp;
  __m256i sum_temp_1;
  __m256i sum_temp_0;
  __m256i exp1_error_hi;
  __m256i exp1_error_lo;
  __m256i exp0_error_hi;
  __m256i exp0_error_lo;
  __m256i err_final_1;
  __m256i err_final_0;
  __m256i error_3;
  __m256i error_2;
  __m256i error_1;
  __m256i error_0;
  __m256i diff_3;
  __m256i diff_2;
  __m256i diff_1;
  __m256i diff_0;
  __m256i _dqcoeff_3;
  __m256i _coeff_3;
  __m256i _dqcoeff_2;
  __m256i _coeff_2;
  __m256i _dqcoeff_1;
  __m256i _coeff_1;
  __m256i _dqcoeff_0;
  __m256i _coeff_0;
  int i;
  __m256i zero;
  int local_564;
  undefined1 (*local_530) [32];
  undefined1 (*local_528) [32];
  
  local_530 = in_RSI;
  local_528 = in_RDI;
  for (local_564 = 0; local_564 < in_RCX; local_564 = local_564 + 0x40) {
    auVar1 = vpsubw_avx2(*local_530,*local_528);
    auVar2 = vpsubw_avx2(local_530[1],local_528[1]);
    auVar3 = vpsubw_avx2(local_530[2],local_528[2]);
    auVar4 = vpsubw_avx2(local_530[3],local_528[3]);
    auVar1 = vpmaddwd_avx2(auVar1,auVar1);
    auVar2 = vpmaddwd_avx2(auVar2,auVar2);
    auVar3 = vpmaddwd_avx2(auVar3,auVar3);
    auVar4 = vpmaddwd_avx2(auVar4,auVar4);
    auVar1 = vpaddd_avx2(auVar1,auVar2);
    auVar2 = vpaddd_avx2(auVar3,auVar4);
    auVar3 = vpunpckldq_avx2(auVar1,ZEXT1632(ZEXT816(0)));
    auVar1 = vpunpckhdq_avx2(auVar1,ZEXT1632(ZEXT816(0)));
    auVar4 = vpunpckldq_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    auVar2 = vpunpckhdq_avx2(auVar2,ZEXT1632(ZEXT816(0)));
    auVar1 = vpaddq_avx2(auVar1,auVar3);
    auVar2 = vpaddq_avx2(auVar2,auVar4);
    auVar1 = vpaddq_avx2(auVar2,auVar1);
    auVar1 = vpaddq_avx2(*in_RDX,auVar1);
    *in_RDX = auVar1;
    local_528 = local_528 + 4;
    local_530 = local_530 + 4;
  }
  return;
}

Assistant:

static inline void av1_block_error_block_size64_avx2(const int16_t *coeff,
                                                     const int16_t *dqcoeff,
                                                     __m256i *sse_256,
                                                     intptr_t block_size) {
  const __m256i zero = _mm256_setzero_si256();
  for (int i = 0; i < block_size; i += 64) {
    // Load 64 elements for coeff and dqcoeff.
    const __m256i _coeff_0 = _mm256_loadu_si256((const __m256i *)coeff);
    const __m256i _dqcoeff_0 = _mm256_loadu_si256((const __m256i *)dqcoeff);
    const __m256i _coeff_1 = _mm256_loadu_si256((const __m256i *)(coeff + 16));
    const __m256i _dqcoeff_1 =
        _mm256_loadu_si256((const __m256i *)(dqcoeff + 16));
    const __m256i _coeff_2 = _mm256_loadu_si256((const __m256i *)(coeff + 32));
    const __m256i _dqcoeff_2 =
        _mm256_loadu_si256((const __m256i *)(dqcoeff + 32));
    const __m256i _coeff_3 = _mm256_loadu_si256((const __m256i *)(coeff + 48));
    const __m256i _dqcoeff_3 =
        _mm256_loadu_si256((const __m256i *)(dqcoeff + 48));

    // d0 d1 d2 d3 d4 d5 d6 d7 d8 d9 d10 d11 d12 d13 d14 d15
    const __m256i diff_0 = _mm256_sub_epi16(_dqcoeff_0, _coeff_0);
    const __m256i diff_1 = _mm256_sub_epi16(_dqcoeff_1, _coeff_1);
    const __m256i diff_2 = _mm256_sub_epi16(_dqcoeff_2, _coeff_2);
    const __m256i diff_3 = _mm256_sub_epi16(_dqcoeff_3, _coeff_3);

    // r0 r1 r2 r3 r4 r5 r6 r7
    const __m256i error_0 = _mm256_madd_epi16(diff_0, diff_0);
    const __m256i error_1 = _mm256_madd_epi16(diff_1, diff_1);
    const __m256i error_2 = _mm256_madd_epi16(diff_2, diff_2);
    const __m256i error_3 = _mm256_madd_epi16(diff_3, diff_3);
    // r00 r01 r02 r03 r04 r05 r06 r07
    const __m256i err_final_0 = _mm256_add_epi32(error_0, error_1);
    // r10 r11 r12 r13 r14 r15 r16 r17
    const __m256i err_final_1 = _mm256_add_epi32(error_2, error_3);

    // For extreme input values, the accumulation needs to happen in 64 bit
    // precision to avoid any overflow. r00 r01 r04 r05
    const __m256i exp0_error_lo = _mm256_unpacklo_epi32(err_final_0, zero);
    // r02 r03 r06 r07
    const __m256i exp0_error_hi = _mm256_unpackhi_epi32(err_final_0, zero);
    // r10 r11 r14 r15
    const __m256i exp1_error_lo = _mm256_unpacklo_epi32(err_final_1, zero);
    // r12 r13 r16 r17
    const __m256i exp1_error_hi = _mm256_unpackhi_epi32(err_final_1, zero);

    const __m256i sum_temp_0 = _mm256_add_epi64(exp0_error_hi, exp0_error_lo);
    const __m256i sum_temp_1 = _mm256_add_epi64(exp1_error_hi, exp1_error_lo);
    const __m256i sse_256_temp = _mm256_add_epi64(sum_temp_1, sum_temp_0);
    *sse_256 = _mm256_add_epi64(*sse_256, sse_256_temp);
    coeff += 64;
    dqcoeff += 64;
  }
}